

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::detail::ReferenceResolver::_store_anchors_and_refs(ReferenceResolver *this,size_t n)

{
  Tree *pTVar1;
  Tree *this_00;
  ulong uVar2;
  NodeType_e NVar3;
  code *pcVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  csubstr *pcVar8;
  csubstr *pcVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  refdata local_60;
  
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fbeda;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[n].m_type.type & KEYREF) == NOTYPE) {
    pTVar1 = this->t;
    if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x4b86;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fbeda;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[n].m_type.type & VALREF) == NOTYPE) {
      pTVar1 = this->t;
      if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x4b86;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fbeda;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar1->m_buf[n].m_type.type & KEY) == NOTYPE) goto LAB_001f0067;
      pcVar8 = Tree::key(this->t,n);
      iVar7 = basic_substring<const_char>::compare(pcVar8,"<<",2);
      if (iVar7 != 0) goto LAB_001f0067;
    }
  }
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fbeda;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  this_00 = this->t;
  if ((pTVar1->m_buf[n].m_type.type & SEQ) != NOTYPE) {
    sVar10 = Tree::first_child(this_00,n);
    if (sVar10 == 0xffffffffffffffff) {
      return;
    }
    do {
      sVar11 = Tree::num_children(this->t,sVar10);
      if (sVar11 != 0) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x66c0;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fbeda;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: t->num_children(ich) == 0",0x27,
                   (anonymous_namespace)::s_default_callbacks);
      }
      local_60.type.type = VALREF;
      local_60.prev_anchor = 0xffffffffffffffff;
      local_60.target = 0xffffffffffffffff;
      local_60.node = sVar10;
      local_60.parent_ref = n;
      local_60.parent_ref_sibling = Tree::next_sibling(this->t,n);
      stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
      sVar10 = Tree::next_sibling(this->t,sVar10);
      if (sVar10 == 0xffffffffffffffff) {
        return;
      }
    } while( true );
  }
  if ((n == 0xffffffffffffffff) || (this_00->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fbeda;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((this_00->m_buf[n].m_type.type & KEYREF) != NOTYPE) {
    pcVar8 = Tree::key(this->t,n);
    iVar7 = basic_substring<const_char>::compare(pcVar8,"<<",2);
    if (iVar7 != 0) {
      pTVar1 = this->t;
      if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x4b86;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fbeda;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar1->m_buf[n].m_type.type & KEY) != NOTYPE) {
        pcVar8 = Tree::key(this->t,n);
        pcVar9 = Tree::key_ref(this->t,n);
        uVar2 = pcVar9->len;
        lVar12 = pcVar8->len - uVar2;
        if (uVar2 <= pcVar8->len) {
          bVar6 = uVar2 == 0;
          if (!bVar6) {
            if (pcVar8->str[lVar12] != *pcVar9->str) goto LAB_001efda6;
            uVar5 = 1;
            do {
              uVar13 = uVar5;
              if (uVar2 == uVar13) break;
              uVar5 = uVar13 + 1;
            } while (pcVar8->str[uVar13 + lVar12] == pcVar9->str[uVar13]);
            bVar6 = uVar2 <= uVar13;
          }
          if (bVar6) goto LAB_001efe1b;
        }
LAB_001efda6:
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x66c7;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fbeda;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: (!t->has_key(n)) || t->key(n).ends_with(t->key_ref(n))",0x44,
                   (anonymous_namespace)::s_default_callbacks);
      }
LAB_001efe1b:
      local_60.type.type = KEYREF;
      local_60.prev_anchor = 0xffffffffffffffff;
      local_60.target = 0xffffffffffffffff;
      local_60.parent_ref = 0xffffffffffffffff;
      local_60.parent_ref_sibling = 0xffffffffffffffff;
      local_60.node = n;
      stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
    }
  }
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fbeda;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[n].m_type.type & VALREF) == NOTYPE) goto LAB_001f0067;
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fbeda;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[n].m_type.type & VAL) != NOTYPE) {
    pcVar8 = Tree::val(this->t,n);
    pcVar9 = Tree::val_ref(this->t,n);
    uVar2 = pcVar9->len;
    lVar12 = pcVar8->len - uVar2;
    if (uVar2 <= pcVar8->len) {
      bVar6 = uVar2 == 0;
      if (!bVar6) {
        if (pcVar8->str[lVar12] != *pcVar9->str) goto LAB_001effcb;
        uVar5 = 1;
        do {
          uVar13 = uVar5;
          if (uVar2 == uVar13) break;
          uVar5 = uVar13 + 1;
        } while (pcVar8->str[uVar13 + lVar12] == pcVar9->str[uVar13]);
        bVar6 = uVar2 <= uVar13;
      }
      if (bVar6) goto LAB_001f0040;
    }
LAB_001effcb:
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x66cc;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fbeda;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: (!t->has_val(n)) || t->val(n).ends_with(t->val_ref(n))",0x44,
               (anonymous_namespace)::s_default_callbacks);
  }
LAB_001f0040:
  local_60.type.type = VALREF;
  local_60.prev_anchor = 0xffffffffffffffff;
  local_60.target = 0xffffffffffffffff;
  local_60.parent_ref = 0xffffffffffffffff;
  local_60.parent_ref_sibling = 0xffffffffffffffff;
  local_60.node = n;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
LAB_001f0067:
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fbeda;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((~(int)pTVar1->m_buf[n].m_type.type & 0x102U) == 0) {
    pTVar1 = this->t;
    if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x4b86;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fbeda;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[n].m_type.type & KEY) == NOTYPE) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x66d2;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fbeda;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: t->has_key(n)",0x1b,(anonymous_namespace)::s_default_callbacks);
    }
    local_60.type.type = KEYANCH;
    local_60.prev_anchor = 0xffffffffffffffff;
    local_60.target = 0xffffffffffffffff;
    local_60.parent_ref = 0xffffffffffffffff;
    local_60.parent_ref_sibling = 0xffffffffffffffff;
    local_60.node = n;
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
  }
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fbeda;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar3 = pTVar1->m_buf[n].m_type.type;
  if ((NVar3 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar3 >> 9 & 1) != 0) {
    pTVar1 = this->t;
    if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x4b86;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fbeda;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[n].m_type.type & VAL) == NOTYPE) {
      pTVar1 = this->t;
      if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x4b86;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fbeda;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar1->m_buf[n].m_type.type & (STREAM|MAP)) == NOTYPE) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x66d7;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fbeda;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: t->has_val(n) || t->is_container(n)",0x31,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    local_60.type.type = VALANCH;
    local_60.prev_anchor = 0xffffffffffffffff;
    local_60.target = 0xffffffffffffffff;
    local_60.parent_ref = 0xffffffffffffffff;
    local_60.parent_ref_sibling = 0xffffffffffffffff;
    local_60.node = n;
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
  }
  for (sVar10 = Tree::first_child(this->t,n); sVar10 != 0xffffffffffffffff;
      sVar10 = Tree::next_sibling(this->t,sVar10)) {
    _store_anchors_and_refs(this,sVar10);
  }
  return;
}

Assistant:

void _store_anchors_and_refs(size_t n)
    {
        if(t->is_key_ref(n) || t->is_val_ref(n) || (t->has_key(n) && t->key(n) == "<<"))
        {
            if(t->is_seq(n))
            {
                // for merging multiple inheritance targets
                //   <<: [ *CENTER, *BIG ]
                for(size_t ich = t->first_child(n); ich != NONE; ich = t->next_sibling(ich))
                {
                    RYML_ASSERT(t->num_children(ich) == 0);
                    refs.push({VALREF, ich, npos, npos, n, t->next_sibling(n)});
                }
                return;
            }
            if(t->is_key_ref(n) && t->key(n) != "<<") // insert key refs BEFORE inserting val refs
            {
                RYML_CHECK((!t->has_key(n)) || t->key(n).ends_with(t->key_ref(n)));
                refs.push({KEYREF, n, npos, npos, NONE, NONE});
            }
            if(t->is_val_ref(n))
            {
                RYML_CHECK((!t->has_val(n)) || t->val(n).ends_with(t->val_ref(n)));
                refs.push({VALREF, n, npos, npos, NONE, NONE});
            }
        }
        if(t->has_key_anchor(n))
        {
            RYML_CHECK(t->has_key(n));
            refs.push({KEYANCH, n, npos, npos, NONE, NONE});
        }
        if(t->has_val_anchor(n))
        {
            RYML_CHECK(t->has_val(n) || t->is_container(n));
            refs.push({VALANCH, n, npos, npos, NONE, NONE});
        }
        for(size_t ch = t->first_child(n); ch != NONE; ch = t->next_sibling(ch))
        {
            _store_anchors_and_refs(ch);
        }
    }